

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFilteringTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::Texture3DFilteringCase::deinit(Texture3DFilteringCase *this)

{
  Texture3D *pTVar1;
  pointer pFVar2;
  
  pTVar1 = this->m_gradientTex;
  if (pTVar1 != (Texture3D *)0x0) {
    glu::Texture3D::~Texture3D(pTVar1);
    operator_delete(pTVar1,0x70);
  }
  pTVar1 = this->m_gridTex;
  if (pTVar1 != (Texture3D *)0x0) {
    glu::Texture3D::~Texture3D(pTVar1);
    operator_delete(pTVar1,0x70);
  }
  this->m_gradientTex = (Texture3D *)0x0;
  this->m_gridTex = (Texture3D *)0x0;
  deqp::gls::TextureTestUtil::TextureRenderer::clear(&this->m_renderer);
  pFVar2 = (this->m_cases).
           super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_cases).
      super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar2) {
    (this->m_cases).
    super__Vector_base<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase,_std::allocator<deqp::gles3::Functional::Texture3DFilteringCase::FilterCase>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar2;
  }
  return;
}

Assistant:

void Texture3DFilteringCase::deinit (void)
{
	delete m_gradientTex;
	delete m_gridTex;

	m_gradientTex	= DE_NULL;
	m_gridTex		= DE_NULL;

	m_renderer.clear();
	m_cases.clear();
}